

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O2

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  int *piVar1;
  long lVar2;
  
  if (S != (SUNLinearSolver)0x0) {
    piVar1 = (int *)S->content;
    if (*(N_Vector *)(piVar1 + 0x20) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)(piVar1 + 0x20));
      piVar1 = (int *)S->content;
    }
    if (*(N_Vector *)(piVar1 + 0x24) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)(piVar1 + 0x24));
      piVar1 = (int *)S->content;
    }
    if (*(N_Vector **)(piVar1 + 0x18) != (N_Vector *)0x0) {
      N_VDestroyVectorArray(*(N_Vector **)(piVar1 + 0x18),*piVar1 + 1);
      piVar1 = (int *)S->content;
    }
    if (*(N_Vector **)(piVar1 + 0x1a) != (N_Vector *)0x0) {
      N_VDestroyVectorArray(*(N_Vector **)(piVar1 + 0x1a),*piVar1 + 1);
      piVar1 = (int *)S->content;
    }
    if (*(long *)(piVar1 + 0x1c) != 0) {
      for (lVar2 = 0; lVar2 <= *piVar1; lVar2 = lVar2 + 1) {
        free(*(void **)((long)*(void **)(piVar1 + 0x1c) + lVar2 * 8));
        piVar1 = (int *)S->content;
      }
      free(*(void **)(piVar1 + 0x1c));
      piVar1 = (int *)S->content;
    }
    free(*(void **)(piVar1 + 0x1e));
    free(*(void **)((long)S->content + 0x88));
    free(*(void **)((long)S->content + 0x98));
    free(*(void **)((long)S->content + 0xa0));
    free(S->content);
    S->content = (void *)0x0;
    free(S->ops);
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from within the content structure */
  if (SPFGMR_CONTENT(S)->xcor)
    N_VDestroy(SPFGMR_CONTENT(S)->xcor);
  if (SPFGMR_CONTENT(S)->vtemp)
    N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
  if (SPFGMR_CONTENT(S)->V)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Z)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Hes) {
    for (k=0; k<=SPFGMR_CONTENT(S)->maxl; k++)
      if (SPFGMR_CONTENT(S)->Hes[k])
        free(SPFGMR_CONTENT(S)->Hes[k]);
    free(SPFGMR_CONTENT(S)->Hes);
  }
  if (SPFGMR_CONTENT(S)->givens)
    free(SPFGMR_CONTENT(S)->givens);
  if (SPFGMR_CONTENT(S)->yg)
    free(SPFGMR_CONTENT(S)->yg);
  if (SPFGMR_CONTENT(S)->cv)
    free(SPFGMR_CONTENT(S)->cv);
  if (SPFGMR_CONTENT(S)->Xv)
    free(SPFGMR_CONTENT(S)->Xv);

  /* delete generic structures */
  free(S->content);  S->content = NULL;
  free(S->ops);  S->ops = NULL;
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}